

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

string * tinyusdz::escapeBackslash
                   (string *__return_storage_ptr__,string *str,bool triple_quoted_string)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  string *psVar5;
  size_type pos;
  string local_70 [8];
  string bs_escaped;
  string local_48 [8];
  string bs;
  size_t i;
  bool triple_quoted_string_local;
  string *str_local;
  string *s;
  
  if (triple_quoted_string) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    for (bs.field_2._8_8_ = 0; uVar1 = bs.field_2._8_8_, uVar2 = std::__cxx11::string::size(),
        (ulong)uVar1 < uVar2; bs.field_2._8_8_ = bs.field_2._8_8_ + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar3 == '\\') {
        uVar2 = bs.field_2._8_8_ + 3;
        uVar4 = std::__cxx11::string::size();
        if (uVar2 < uVar4) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
          if (((*pcVar3 == '\'') &&
              (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar3 == '\'')) &&
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar3 == '\'')) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\'\'\'");
            bs.field_2._8_8_ = bs.field_2._8_8_ + 3;
          }
          else {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
            if (((*pcVar3 == '\"') &&
                (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar3 == '\"')) &&
               (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar3 == '\"')) {
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"\"\"");
              bs.field_2._8_8_ = bs.field_2._8_8_ + 3;
            }
            else {
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
            }
          }
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
        }
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"\\",(allocator *)(bs_escaped.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(bs_escaped.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"\\\\",(allocator *)((long)&pos + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
    pos._6_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
    while (uVar2 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_48),
          uVar2 != 0xffffffffffffffff) {
      psVar5 = (string *)std::__cxx11::string::length();
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,psVar5);
      std::__cxx11::string::length();
    }
    pos._6_1_ = 1;
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escapeBackslash(const std::string &str,
                            const bool triple_quoted_string) {
  if (triple_quoted_string) {
    std::string s;

    // Do not escape \""" or \'''

    for (size_t i = 0; i < str.size(); i++) {
      if (str[i] == '\\') {
        if (i + 3 < str.size()) {
          if ((str[i + 1] == '\'') && (str[i + 2] == '\'') &&
              (str[i + 3] == '\'')) {
            s += "\\'''";
            i += 3;
          } else if ((str[i + 1] == '"') && (str[i + 2] == '"') &&
                     (str[i + 3] == '"')) {
            s += "\\\"\"\"";
            i += 3;
          } else {
            s += "\\\\";
          }
        } else {
          s += "\\\\";
        }
      } else {
        s += str[i];
      }
    }

    return s;
  } else {
    const std::string bs = "\\";
    const std::string bs_escaped = "\\\\";

    std::string s = str;

    std::string::size_type pos = 0;
    while ((pos = s.find(bs, pos)) != std::string::npos) {
      s.replace(pos, bs.length(), bs_escaped);
      pos += bs_escaped.length();
    }

    return s;
  }
}